

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_mask_ensure(PS_Mask mask,FT_UInt count,FT_Memory memory)

{
  uint uVar1;
  FT_Byte *pFVar2;
  FT_Error local_2c;
  uint local_28;
  FT_Error error;
  FT_UInt new_max;
  FT_UInt old_max;
  FT_Memory memory_local;
  PS_Mask pPStack_10;
  FT_UInt count_local;
  PS_Mask mask_local;
  
  error = mask->max_bits >> 3;
  uVar1 = count + 7 >> 3;
  local_2c = 0;
  if ((uint)error < uVar1) {
    local_28 = uVar1 + 7 & 0xfffffff8;
    _new_max = memory;
    memory_local._4_4_ = count;
    pPStack_10 = mask;
    pFVar2 = (FT_Byte *)
             ft_mem_realloc(memory,1,(ulong)(uint)error,(ulong)local_28,mask->bytes,&local_2c);
    pPStack_10->bytes = pFVar2;
    if (local_2c == 0) {
      pPStack_10->max_bits = local_28 << 3;
    }
  }
  return local_2c;
}

Assistant:

static FT_Error
  ps_mask_ensure( PS_Mask    mask,
                  FT_UInt    count,
                  FT_Memory  memory )
  {
    FT_UInt   old_max = mask->max_bits >> 3;
    FT_UInt   new_max = ( count + 7 ) >> 3;
    FT_Error  error   = FT_Err_Ok;


    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 8 );
      /* added bytes are zeroed here */
      if ( !FT_RENEW_ARRAY( mask->bytes, old_max, new_max ) )
        mask->max_bits = new_max * 8;
    }
    return error;
  }